

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O1

CURLcode Curl_add_handle_to_pipeline(Curl_easy *handle,connectdata *conn)

{
  curl_llist_element *pcVar1;
  curl_llist_element *pcVar2;
  
  pcVar1 = (conn->send_pipe).head;
  Curl_llist_insert_next(&conn->send_pipe,(conn->send_pipe).tail,handle,&handle->pipeline_queue);
  pcVar2 = (conn->send_pipe).head;
  if (pcVar1 != pcVar2) {
    conn->writechannel_inuse = false;
    Curl_expire((Curl_easy *)pcVar2->ptr,0,EXPIRE_RUN_NOW);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_add_handle_to_pipeline(struct Curl_easy *handle,
                                     struct connectdata *conn)
{
  struct curl_llist_element *sendhead = conn->send_pipe.head;
  struct curl_llist *pipeline;
  CURLcode result;

  pipeline = &conn->send_pipe;

  result = addHandleToPipeline(handle, pipeline);

  if(pipeline == &conn->send_pipe && sendhead != conn->send_pipe.head) {
    /* this is a new one as head, expire it */
    Curl_pipeline_leave_write(conn); /* not in use yet */
    Curl_expire(conn->send_pipe.head->ptr, 0, EXPIRE_RUN_NOW);
  }

#if 0 /* enable for pipeline debugging */
  print_pipeline(conn);
#endif

  return result;
}